

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
Centaurus::NFA<unsigned_char>::epsilon_closure
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
          NFA<unsigned_char> *this,set<int,_std::less<int>,_std::allocator<int>_> *indices,
          bool *long_flag)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var3 = (indices->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(indices->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    bVar2 = epsilon_closure_sub(this,__return_storage_ptr__,p_Var3[1]._M_color);
    *long_flag = (bool)(*long_flag | bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<int> epsilon_closure(const std::set<int>& indices, bool& long_flag) const
    {
        std::set<int> ret;

        for (int index : indices)
        {
            long_flag |= epsilon_closure_sub(ret, index);
        }

        return ret;
    }